

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O1

bool __thiscall
rapidjson::internal::BigInteger::Difference(BigInteger *this,BigInteger *rhs,BigInteger *out)

{
  long lVar1;
  uint uVar2;
  BigInteger *pBVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = this->count_;
  if (uVar4 == rhs->count_) {
    do {
      if (uVar4 == 0) {
        uVar2 = 0;
        goto LAB_0047f346;
      }
      lVar5 = uVar4 - 1;
      lVar1 = uVar4 - 1;
      uVar4 = uVar4 - 1;
    } while (this->digits_[lVar5] == rhs->digits_[lVar1]);
    bVar7 = this->digits_[lVar5] < rhs->digits_[lVar1];
  }
  else {
    bVar7 = uVar4 < rhs->count_;
  }
  uVar2 = -(uint)bVar7 | 1;
LAB_0047f346:
  if (uVar2 == 0) {
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                  ,0xbc,
                  "bool rapidjson::internal::BigInteger::Difference(const BigInteger &, BigInteger *) const"
                 );
  }
  pBVar3 = rhs;
  if ((int)uVar2 < 0) {
    pBVar3 = this;
    this = rhs;
  }
  if (this->count_ != 0) {
    uVar4 = 0;
    lVar5 = 0;
    do {
      uVar6 = lVar5 + this->digits_[uVar4];
      if (uVar4 < pBVar3->count_) {
        uVar6 = uVar6 - pBVar3->digits_[uVar4];
      }
      lVar5 = -(ulong)(this->digits_[uVar4] < uVar6);
      out->digits_[uVar4] = uVar6;
      if (uVar6 != 0) {
        out->count_ = uVar4 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->count_);
  }
  return SUB41(uVar2 >> 0x1f,0);
}

Assistant:

bool Difference(const BigInteger& rhs, BigInteger* out) const {
        int cmp = Compare(rhs);
        RAPIDJSON_ASSERT(cmp != 0);
        const BigInteger *a, *b;  // Makes a > b
        bool ret;
        if (cmp < 0) { a = &rhs; b = this; ret = true; }
        else         { a = this; b = &rhs; ret = false; }

        Type borrow = 0;
        for (size_t i = 0; i < a->count_; i++) {
            Type d = a->digits_[i] - borrow;
            if (i < b->count_)
                d -= b->digits_[i];
            borrow = (d > a->digits_[i]) ? 1 : 0;
            out->digits_[i] = d;
            if (d != 0)
                out->count_ = i + 1;
        }

        return ret;
    }